

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O2

float deqp::gles3::Performance::vectorFloatFirstQuartile<long>
                (vector<long,_std::allocator<long>_> *v)

{
  float fVar1;
  _Vector_base<long,_std::allocator<long>_> local_20;
  
  vectorLowestPercentage<long>((vector<long,_std::allocator<long>_> *)&local_20,v,0.5);
  fVar1 = vectorFloatMedian<long>((vector<long,_std::allocator<long>_> *)&local_20);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_20);
  return fVar1;
}

Assistant:

static float vectorFloatFirstQuartile (const vector<T>& v)
{
	return vectorFloatMedian(vectorLowestPercentage(v, 0.5f));
}